

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void DoHorizontalFilter_SSE2(uint8_t *in,int width,int height,int stride,uint8_t *out)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined1 *in_RDI;
  undefined1 *in_R8;
  int row;
  int local_24;
  char *local_20;
  char *local_8;
  
  *in_R8 = *in_RDI;
  PredictLineLeft_SSE2(in_RDI + 1,in_R8 + 1,in_ESI + -1);
  local_8 = in_RDI + in_ECX;
  local_20 = in_R8 + in_ECX;
  for (local_24 = 1; local_24 < in_EDX; local_24 = local_24 + 1) {
    *local_20 = *local_8 - local_8[-in_ECX];
    PredictLineLeft_SSE2((uint8_t *)(local_8 + 1),(uint8_t *)(local_20 + 1),in_ESI + -1);
    local_8 = local_8 + in_ECX;
    local_20 = local_20 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoHorizontalFilter_SSE2(
    const uint8_t* WEBP_RESTRICT in, int width, int height, int stride,
    uint8_t* WEBP_RESTRICT out) {
  int row;
  DCHECK(in, out);

  // Leftmost pixel is the same as input for topmost scanline.
  out[0] = in[0];
  PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
  in += stride;
  out += stride;

  // Filter line-by-line.
  for (row = 1; row < height; ++row) {
    // Leftmost pixel is predicted from above.
    out[0] = in[0] - in[-stride];
    PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
    in += stride;
    out += stride;
  }
}